

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_test.c
# Opt level: O1

void test_msg_large(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  void *pvVar5;
  undefined1 local_428 [8];
  char chunk [1024];
  nng_msg *local_20;
  nng_msg *msg;
  
  nVar1 = nng_msg_alloc(&local_20,0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0xd7,"%s: expected success, got %s (%d)","nng_msg_alloc(&msg, 0)",pcVar3,
                         nVar1);
  if (iVar2 != 0) {
    memset(local_428,0x2b,0x400);
    nVar1 = nng_msg_append(local_20,"abc",4);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                           ,0xd9,"%s: expected success, got %s (%d)",
                           "nng_msg_append(msg, \"abc\", strlen(\"abc\") + 1)",pcVar3,nVar1);
    if (iVar2 != 0) {
      sVar4 = nng_msg_len(local_20);
      iVar2 = acutest_check_((uint)(sVar4 == 4),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                             ,0xda,"%s","nng_msg_len(msg) == strlen(\"abc\") + 1");
      if (iVar2 != 0) {
        nVar1 = nng_msg_insert(local_20,local_428,0x400);
        pcVar3 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                               ,0xdb,"%s: expected success, got %s (%d)",
                               "nng_msg_insert(msg, chunk, sizeof(chunk))",pcVar3,nVar1);
        if (iVar2 != 0) {
          sVar4 = nng_msg_len(local_20);
          iVar2 = acutest_check_((uint)(sVar4 == 0x404),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                 ,0xdc,"%s",
                                 "nng_msg_len(msg) == strlen(\"abc\") + 1 + sizeof(chunk)");
          if (iVar2 != 0) {
            pvVar5 = nng_msg_body(local_20);
            iVar2 = bcmp(local_428,pvVar5,0x400);
            iVar2 = acutest_check_((uint)(iVar2 == 0),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                   ,0xdd,"%s","memcmp(chunk, nng_msg_body(msg), sizeof(chunk)) == 0"
                                  );
            if (iVar2 != 0) {
              pvVar5 = nng_msg_body(local_20);
              iVar2 = strcmp((char *)((long)pvVar5 + 0x400),"abc");
              iVar2 = acutest_check_((uint)(iVar2 == 0),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                     ,0xdf,"%s",
                                     "strcmp((char *) nng_msg_body(msg) + sizeof(chunk), \"abc\") == 0"
                                    );
              if (iVar2 != 0) {
                nVar1 = nng_msg_trim(local_20,0x3fe);
                pcVar3 = nng_strerror(nVar1);
                iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                       ,0xe0,"%s: expected success, got %s (%d)",
                                       "nng_msg_trim(msg, sizeof(chunk) - 2)",pcVar3,nVar1);
                if (iVar2 != 0) {
                  pcVar3 = (char *)nng_msg_body(local_20);
                  iVar2 = strcmp(pcVar3,"++abc");
                  iVar2 = acutest_check_((uint)(iVar2 == 0),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                         ,0xe1,"%s","strcmp(nng_msg_body(msg), \"++abc\") == 0");
                  if (iVar2 != 0) {
                    nng_msg_free(local_20);
                    return;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
test_msg_large(void)
{
	nng_msg *msg;
	char     chunk[1024];
	NUTS_PASS(nng_msg_alloc(&msg, 0));
	memset(chunk, '+', sizeof(chunk));
	NUTS_PASS(nng_msg_append(msg, "abc", strlen("abc") + 1));
	NUTS_ASSERT(nng_msg_len(msg) == strlen("abc") + 1);
	NUTS_PASS(nng_msg_insert(msg, chunk, sizeof(chunk)));
	NUTS_ASSERT(nng_msg_len(msg) == strlen("abc") + 1 + sizeof(chunk));
	NUTS_ASSERT(memcmp(chunk, nng_msg_body(msg), sizeof(chunk)) == 0);
	NUTS_ASSERT(
	    strcmp((char *) nng_msg_body(msg) + sizeof(chunk), "abc") == 0);
	NUTS_PASS(nng_msg_trim(msg, sizeof(chunk) - 2));
	NUTS_ASSERT(strcmp(nng_msg_body(msg), "++abc") == 0);
	nng_msg_free(msg);
}